

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O0

short __thiscall xercesc_4_0::DOMNodeImpl::compareDocumentPosition(DOMNodeImpl *this,DOMNode *other)

{
  ushort uVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  DOMNode *pDVar5;
  DOMNode *pDVar6;
  undefined4 extraout_var;
  bool bVar7;
  bool bVar8;
  bool bHisNodeIsChild;
  bool bMyNodeIsChild;
  short hisNodeType;
  DOMNode *pDStack_68;
  short myNodeType;
  DOMNode *hisNodeP;
  DOMNode *myNodeP;
  int local_50;
  int i_1;
  int i;
  int hisDepth;
  DOMNode *hisRoot;
  DOMNode *pDStack_38;
  int myDepth;
  DOMNode *myRoot;
  DOMNode *tmpNode;
  DOMNode *thisNode;
  DOMNode *other_local;
  DOMNodeImpl *this_local;
  
  pDVar5 = getContainingNode(this);
  if (pDVar5 == other) {
    this_local._6_2_ = 0;
  }
  else {
    iVar4 = (*pDVar5->_vptr_DOMNode[4])();
    if (iVar4 < 0xd) {
      iVar4 = (*other->_vptr_DOMNode[4])();
      if (iVar4 < 0xd) {
        pDStack_38 = getContainingNode(this);
        hisRoot._4_4_ = 0;
        while (pDVar6 = getTreeParentNode(this,pDStack_38), pDVar6 != (DOMNode *)0x0) {
          if (pDVar6 == other) {
            return 10;
          }
          hisRoot._4_4_ = hisRoot._4_4_ + 1;
          pDStack_38 = pDVar6;
        }
        i_1 = 0;
        _i = other;
        while (pDVar6 = getTreeParentNode(this,_i), pDVar6 != (DOMNode *)0x0) {
          if (pDVar6 == pDVar5) {
            return 0x14;
          }
          i_1 = i_1 + 1;
          _i = pDVar6;
        }
        if (pDStack_38 == _i) {
          pDStack_38 = getContainingNode(this);
          _i = other;
          if (i_1 < hisRoot._4_4_) {
            for (local_50 = 0; local_50 < hisRoot._4_4_ - i_1; local_50 = local_50 + 1) {
              pDStack_38 = getTreeParentNode(this,pDStack_38);
            }
          }
          else {
            for (myNodeP._4_4_ = 0; myNodeP._4_4_ < i_1 - hisRoot._4_4_;
                myNodeP._4_4_ = myNodeP._4_4_ + 1) {
              _i = getTreeParentNode(this,_i);
            }
          }
          hisNodeP = pDStack_38;
          pDStack_68 = _i;
          for (; pDStack_38 != _i; _i = getTreeParentNode(this,_i)) {
            hisNodeP = pDStack_38;
            pDStack_68 = _i;
            pDStack_38 = getTreeParentNode(this,pDStack_38);
          }
          iVar4 = (*hisNodeP->_vptr_DOMNode[4])();
          sVar2 = (short)iVar4;
          iVar4 = (*pDStack_68->_vptr_DOMNode[4])();
          sVar3 = (short)iVar4;
          bVar7 = false;
          if ((sVar2 != 2) && (bVar7 = false, sVar2 != 6)) {
            bVar7 = sVar2 != 0xc;
          }
          bVar8 = false;
          if ((sVar3 != 2) && (bVar8 = false, sVar3 != 6)) {
            bVar8 = sVar3 != 0xc;
          }
          if ((bVar7) && (bVar8)) {
            do {
              if (hisNodeP == (DOMNode *)0x0) {
                return 2;
              }
              iVar4 = (*hisNodeP->_vptr_DOMNode[10])();
              hisNodeP = (DOMNode *)CONCAT44(extraout_var,iVar4);
            } while (hisNodeP != pDStack_68);
            this_local._6_2_ = 4;
          }
          else if ((bVar7) || (!bVar8)) {
            if ((!bVar7) || (bVar8)) {
              if (sVar2 == sVar3) {
                uVar1 = 2;
                if (hisNodeP < pDStack_68) {
                  uVar1 = 4;
                }
                this_local._6_2_ = uVar1 | 0x20;
              }
              else {
                this_local._6_2_ = 2;
                if (sVar2 < sVar3) {
                  this_local._6_2_ = 4;
                }
              }
            }
            else {
              this_local._6_2_ = 2;
            }
          }
          else {
            this_local._6_2_ = 4;
          }
        }
        else {
          uVar1 = 4;
          if (pDStack_38 < _i) {
            uVar1 = 2;
          }
          this_local._6_2_ = uVar1 | 0x21;
        }
      }
      else {
        iVar4 = (*other->_vptr_DOMNode[0x20])(other,pDVar5);
        this_local._6_2_ = reverseTreeOrderBitPattern(this,(short)iVar4);
      }
    }
    else {
      this_local._6_2_ = 0;
    }
  }
  return this_local._6_2_;
}

Assistant:

short DOMNodeImpl::compareDocumentPosition(const DOMNode* other) const {
    const DOMNode* thisNode = getContainingNode();

    // If the two nodes being compared are the same node, then no flags are set on the return.
    if (thisNode == other)
        return 0;

    //if this is a custom node, we don't really know what to do, just return
    //user should provide its own compareDocumentPosition logic, and shouldn't reach here
    if(thisNode->getNodeType() > 12) {
        return 0;
    }

    //if it is a custom node we must ask it for the order
    if(other->getNodeType() > 12) {
        return reverseTreeOrderBitPattern(other->compareDocumentPosition(thisNode));
    }

    // Otherwise, the order of two nodes is determined by looking for common containers --
    // containers which contain both. A node directly contains any child nodes.
    // A node also directly contains any other nodes attached to it such as attributes
    // contained in an element or entities and notations contained in a document type.
    // Nodes contained in contained nodes are also contained, but less-directly as
    // the number of intervening containers increases.

    // If one of the nodes being compared contains the other node, then the container precedes
    // the contained node, and reversely the contained node follows the container. For example,
    // when comparing an element against its own attribute or child, the element node precedes
    // its attribute node and its child node, which both follow it.

    const DOMNode* tmpNode;
    const DOMNode* myRoot = getContainingNode();
    int myDepth=0;
    while((tmpNode=getTreeParentNode(myRoot))!=0)
    {
        myRoot=tmpNode;
        if(myRoot==other)
            return DOMNode::DOCUMENT_POSITION_CONTAINS | DOMNode::DOCUMENT_POSITION_PRECEDING;
        myDepth++;
    }

    const DOMNode* hisRoot = other;
    int hisDepth=0;
    while((tmpNode=getTreeParentNode(hisRoot))!=0)
    {
        hisRoot=tmpNode;
        if(hisRoot==thisNode)
            return DOMNode::DOCUMENT_POSITION_CONTAINED_BY | DOMNode::DOCUMENT_POSITION_FOLLOWING;
        hisDepth++;
    }

    // If there is no common container node, then the order is based upon order between the
    // root container of each node that is in no container. In this case, the result is
    // disconnected and implementation-specific. This result is stable as long as these
    // outer-most containing nodes remain in memory and are not inserted into some other
    // containing node. This would be the case when the nodes belong to different documents
    // or fragments, and cloning the document or inserting a fragment might change the order.

    if(myRoot!=hisRoot)
        return DOMNode::DOCUMENT_POSITION_DISCONNECTED | DOMNode::DOCUMENT_POSITION_IMPLEMENTATION_SPECIFIC |
              (myRoot<hisRoot?DOMNode::DOCUMENT_POSITION_PRECEDING:DOMNode::DOCUMENT_POSITION_FOLLOWING);

    // If neither of the previous cases apply, then there exists a most-direct container common
    // to both nodes being compared. In this case, the order is determined based upon the two
    // determining nodes directly contained in this most-direct common container that either
    // are or contain the corresponding nodes being compared.

    // if the two depths are different, go to the same one
    myRoot = getContainingNode();
    hisRoot = other;
    if (myDepth > hisDepth) {
        for (int i= 0 ; i < myDepth - hisDepth; i++)
            myRoot = getTreeParentNode(myRoot);
    }
    else {
        for (int i = 0; i < hisDepth - myDepth; i++)
            hisRoot = getTreeParentNode(hisRoot);
    }

    // We now have nodes at the same depth in the tree.  Find a common ancestor.
    const DOMNode *myNodeP=myRoot;
	const DOMNode *hisNodeP=hisRoot;
    while(myRoot!=hisRoot)
    {
        myNodeP = myRoot;
        hisNodeP = hisRoot;
        myRoot = getTreeParentNode(myRoot);
        hisRoot = getTreeParentNode(hisRoot);
    }

    short myNodeType=myNodeP->getNodeType();
    short hisNodeType=hisNodeP->getNodeType();
    bool bMyNodeIsChild=(myNodeType!=DOMNode::ATTRIBUTE_NODE && myNodeType!=DOMNode::ENTITY_NODE && myNodeType!=DOMNode::NOTATION_NODE);
    bool bHisNodeIsChild=(hisNodeType!=DOMNode::ATTRIBUTE_NODE && hisNodeType!=DOMNode::ENTITY_NODE && hisNodeType!=DOMNode::NOTATION_NODE);

    // If these two determining nodes are both child nodes, then the natural DOM order of these
    // determining nodes within the containing node is returned as the order of the corresponding nodes.
    // This would be the case, for example, when comparing two child elements of the same element.
    if(bMyNodeIsChild && bHisNodeIsChild)
    {
        while(myNodeP != 0)
        {
            myNodeP = myNodeP->getNextSibling();
            if(myNodeP == hisNodeP)
                return DOMNode::DOCUMENT_POSITION_FOLLOWING;
        }
        return DOMNode::DOCUMENT_POSITION_PRECEDING;
    }

    // If one of the two determining nodes is a child node and the other is not, then the corresponding
    // node of the child node follows the corresponding node of the non-child node. This would be the case,
    // for example, when comparing an attribute of an element with a child element of the same element.
    else if(!bMyNodeIsChild && bHisNodeIsChild)
        return DOMNode::DOCUMENT_POSITION_FOLLOWING;
    else if(bMyNodeIsChild && !bHisNodeIsChild)
        return DOMNode::DOCUMENT_POSITION_PRECEDING;

    else
    {
        // If neither of the two determining node is a child node and one determining node has a greater value
        // of nodeType than the other, then the corresponding node precedes the other. This would be the case,
        // for example, when comparing an entity of a document type against a notation of the same document type.
        if(myNodeType!=hisNodeType)
            return (myNodeType<hisNodeType)?DOMNode::DOCUMENT_POSITION_FOLLOWING:DOMNode::DOCUMENT_POSITION_PRECEDING;

        // If neither of the two determining node is a child node and nodeType is the same for both determining
        // nodes, then an implementation-dependent order between the determining nodes is returned. This order
        // is stable as long as no nodes of the same nodeType are inserted into or removed from the direct container.
        // This would be the case, for example, when comparing two attributes of the same element, and inserting
        // or removing additional attributes might change the order between existing attributes.
        return DOMNode::DOCUMENT_POSITION_IMPLEMENTATION_SPECIFIC | ((myNodeP<hisNodeP)?DOMNode::DOCUMENT_POSITION_FOLLOWING:DOMNode::DOCUMENT_POSITION_PRECEDING);
    }
    // REVISIT:  shouldn't get here.   Should probably throw an
    // exception
    return 0;
}